

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O1

void __thiscall
cpp_client::Any::Any<std::shared_ptr<cpp_client::Base_object>>
          (Any *this,shared_ptr<cpp_client::Base_object> *other)

{
  holder hVar1;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var2;
  
  _Var2._M_head_impl = (holder *)operator_new(0x18);
  (_Var2._M_head_impl)->_vptr_holder = (_func_int **)&PTR__holder2_00139528;
  _Var2._M_head_impl[1]._vptr_holder =
       (_func_int **)
       (other->super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  _Var2._M_head_impl[2]._vptr_holder = (_func_int **)0x0;
  hVar1._vptr_holder =
       (_func_int **)
       (other->super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  (other->super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var2._M_head_impl[2]._vptr_holder = hVar1._vptr_holder;
  (other->super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->data_)._M_t.
  super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>._M_t
  .super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>.
  super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl = _Var2._M_head_impl;
  return;
}

Assistant:

Any(T&& other) noexcept :
      data_(new holder2<T>(std::forward<T>(other)))
   {
      ;
   }